

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestIsInitialized_SubMessage::ByteSizeLong(TestIsInitialized_SubMessage *this)

{
  uint32_t *puVar1;
  size_t sVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestIsInitialized_SubMessage *this_;
  TestIsInitialized_SubMessage *this_local;
  
  sStack_20 = 0;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    sStack_20 = google::protobuf::internal::WireFormatLite::
                GroupSize<edition_unittest::TestIsInitialized_SubMessage_SubGroup>
                          ((this->field_0)._impl_.subgroup_);
    sStack_20 = sStack_20 + 2;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestIsInitialized_SubMessage::ByteSizeLong() const {
  const TestIsInitialized_SubMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestIsInitialized.SubMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // .edition_unittest.TestIsInitialized.SubMessage.SubGroup subgroup = 1 [features = {
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.subgroup_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}